

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int __thiscall AActor::ApplyDamageFactor(AActor *this,FName *damagetype,int damage)

{
  int iVar1;
  undefined4 extraout_var;
  int damage_00;
  FName local_14;
  PClass *pPVar2;
  
  damage_00 = (int)((double)damage * this->DamageFactor);
  if (0 < damage_00) {
    pPVar2 = (this->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar2;
    }
    damage_00 = DamageTypeDefinition::ApplyMobjDamageFactor
                          (damage_00,&local_14,
                           (DmgFactors *)
                           pPVar2[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                           HashNext);
  }
  return damage_00;
}

Assistant:

int AActor::ApplyDamageFactor(FName damagetype, int damage) const
{
	damage = int(damage * DamageFactor);
	if (damage > 0)
	{
		damage = DamageTypeDefinition::ApplyMobjDamageFactor(damage, damagetype, GetClass()->DamageFactors);
	}
	return damage;
}